

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O1

void __thiscall SQInstance::Finalize(SQInstance *this)

{
  SQUnsignedInteger *pSVar1;
  long *plVar2;
  undefined8 *puVar3;
  uint uVar4;
  SQClass *pSVar5;
  long *plVar6;
  ulong uVar7;
  long lVar8;
  
  pSVar5 = this->_class;
  uVar7 = (ulong)(pSVar5->_defaultvalues)._size;
  if (pSVar5 != (SQClass *)0x0) {
    pSVar1 = &(pSVar5->super_SQCollectable).super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar5->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
    }
    this->_class = (SQClass *)0x0;
  }
  if (uVar7 != 0) {
    lVar8 = 0;
    do {
      plVar6 = *(long **)((long)&this->_values[0].super_SQObject._unVal + lVar8);
      uVar4 = *(uint *)((long)&this->_values[0].super_SQObject._type + lVar8);
      puVar3 = (undefined8 *)((long)&this->_values[0].super_SQObject._type + lVar8);
      *puVar3 = 0;
      puVar3[1] = 0;
      *(undefined4 *)((long)&this->_values[0].super_SQObject._type + lVar8) = 0x1000001;
      if ((uVar4 >> 0x1b & 1) != 0) {
        plVar2 = plVar6 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar6 + 0x10))();
        }
      }
      lVar8 = lVar8 + 0x10;
    } while (uVar7 << 4 != lVar8);
  }
  return;
}

Assistant:

void SQInstance::Finalize()
{
    SQUnsignedInteger nvalues = _class->_defaultvalues.size();
    __ObjRelease(_class);
    _NULL_SQOBJECT_VECTOR(_values,nvalues);
}